

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *zContent;
  char cVar1;
  int iVar2;
  uint uVar3;
  JsonNode *pJVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  u8 *puVar9;
  char *__s2;
  int iVar10;
  u32 uVar11;
  JsonNode *pJVar12;
  ulong local_78;
  
  local_78 = (ulong)iRoot;
  pJVar4 = pParse->aNode;
LAB_001b5322:
  pJVar12 = pJVar4 + local_78;
  cVar1 = *zPath;
  if (cVar1 == '.') {
    if (pJVar12->eType == '\a') {
      zContent = zPath + 1;
      cVar1 = zPath[1];
      if (cVar1 == '\"') {
        uVar5 = 0;
        while( true ) {
          uVar3 = (int)uVar5 + 1;
          if (zContent[uVar3] == '\0') goto LAB_001b55ec;
          if (zContent[uVar3] == '\"') break;
          uVar5 = (ulong)uVar3;
        }
        uVar6 = (ulong)((int)uVar5 + 2);
        __s2 = zPath + 2;
      }
      else {
        uVar6 = 0;
        while (((__s2 = zContent, uVar5 = uVar6, cVar1 != '\0' && (cVar1 != '.')) && (cVar1 != '['))
              ) {
          uVar6 = (ulong)((int)uVar6 + 1);
          cVar1 = zContent[uVar6];
        }
      }
      uVar11 = (u32)uVar5;
      if (uVar11 != 0) {
        do {
          uVar3 = pJVar12->n;
          uVar8 = 1;
          while( true ) {
            uVar7 = (uint)uVar8;
            iVar2 = (int)local_78;
            if (uVar3 < uVar7) break;
            if ((pJVar12[uVar8].jnFlags & 1) == 0) {
              if (pJVar12[uVar8].n == uVar11 + 2) {
                puVar9 = &(pJVar12[uVar8].u.pPatch)->jnFlags;
LAB_001b54f1:
                iVar10 = strncmp((char *)puVar9,__s2,uVar5);
                if (iVar10 == 0) {
                  local_78 = (ulong)(iVar2 + uVar7 + 1);
                  zPath = zContent + uVar6;
                  goto LAB_001b5322;
                }
              }
            }
            else if (pJVar12[uVar8].n == uVar11) {
              puVar9 = (u8 *)pJVar12[uVar8].u.zJContent;
              goto LAB_001b54f1;
            }
            uVar7 = uVar7 + 1;
            iVar2 = 1;
            if (5 < pJVar12[uVar7].eType) {
              iVar2 = pJVar12[uVar7].n + 1;
            }
            uVar8 = (ulong)(iVar2 + uVar7);
          }
          if ((pJVar12->jnFlags & 0x20) == 0) {
            if (pApnd == (int *)0x0) {
              return (JsonNode *)0x0;
            }
            iVar10 = jsonParseAddNode(pParse,7,2,(char *)0x0);
            uVar3 = jsonParseAddNode(pParse,5,(u32)uVar6,zContent);
            pJVar4 = jsonLookupAppend(pParse,zContent + uVar6,pApnd,pzErr);
            if (pParse->oom == '\0') {
              if (pJVar4 != (JsonNode *)0x0) {
                pJVar12 = pParse->aNode;
                pJVar12[local_78].u.iAppend = iVar10 - iVar2;
                puVar9 = &pJVar12[local_78].jnFlags;
                *puVar9 = *puVar9 | 0x20;
                puVar9 = &pParse->aNode[uVar3].jnFlags;
                *puVar9 = *puVar9 | 1;
                return pJVar4;
              }
              return (JsonNode *)0x0;
            }
            return (JsonNode *)0x0;
          }
          local_78 = (ulong)(iVar2 + (pJVar12->u).iAppend);
          pJVar12 = pJVar4 + local_78;
        } while( true );
      }
LAB_001b55ec:
      *pzErr = zContent;
    }
  }
  else {
    if (cVar1 == '[') {
      uVar6 = (ulong)(byte)zPath[1];
      if (0xfffffffffffffff5 < uVar6 - 0x3a) {
        if (pJVar12->eType != '\x06') {
          return (JsonNode *)0x0;
        }
        iVar2 = 0;
        uVar5 = 2;
        while( true ) {
          if (uVar6 - 0x3a < 0xfffffffffffffff6) break;
          iVar2 = iVar2 * 10 + (int)(char)uVar6 + -0x30;
          uVar6 = (ulong)(byte)zPath[uVar5];
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        if ((char)uVar6 == ']') {
          zPath = zPath + uVar5;
          do {
            uVar6 = 1;
            while( true ) {
              uVar3 = (uint)uVar6;
              iVar10 = (int)local_78;
              if (pJVar12->n < uVar3) break;
              if ((iVar2 == 0) && ((pJVar12[uVar6].jnFlags & 4) == 0)) {
                iVar2 = 0;
                if ((pJVar12->jnFlags & 0x20) != 0) goto LAB_001b53ff;
                local_78 = (ulong)(uVar3 + iVar10);
                goto LAB_001b5322;
              }
              iVar10 = 1;
              if (5 < pJVar12[uVar6].eType) {
                iVar10 = pJVar12[uVar6].n + 1;
              }
              iVar2 = iVar2 + (char)(((pJVar12[uVar6].jnFlags >> 2 & 1) != 0) + -1);
              uVar6 = (ulong)(uVar3 + iVar10);
            }
            if ((pJVar12->jnFlags & 0x20) == 0) {
              if (pApnd == (int *)0x0) {
                return (JsonNode *)0x0;
              }
              if (iVar2 != 0) {
                return (JsonNode *)0x0;
              }
              iVar2 = jsonParseAddNode(pParse,6,1,(char *)0x0);
              pJVar4 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
              if (pParse->oom != '\0') {
                return (JsonNode *)0x0;
              }
              if (pJVar4 != (JsonNode *)0x0) {
                pJVar12 = pParse->aNode;
                pJVar12[local_78].u.iAppend = iVar2 - iVar10;
                puVar9 = &pJVar12[local_78].jnFlags;
                *puVar9 = *puVar9 | 0x20;
                return pJVar4;
              }
              return (JsonNode *)0x0;
            }
LAB_001b53ff:
            local_78 = (ulong)(iVar10 + (pJVar12->u).iAppend);
            pJVar12 = pJVar4 + local_78;
          } while( true );
        }
      }
    }
    else if (cVar1 == '\0') {
      return pJVar12;
    }
    *pzErr = zPath;
  }
  return (JsonNode *)0x0;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
    }
    if( nKey==0 ){
      *pzErr = zPath;
      return 0;
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, i, zPath);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' && safe_isdigit(zPath[1]) ){
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    i = 0;
    j = 1;
    while( safe_isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( zPath[j]!=']' ){
      *pzErr = zPath;
      return 0;
    }
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}